

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O0

bool remote::FindProcessByName(string *name,Handle *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  DIR *__dirp;
  dirent *pdVar4;
  char *__name;
  long lVar5;
  string local_160 [8];
  string exeName;
  size_t namePos;
  string procPath;
  allocator local_111;
  string local_110 [32];
  undefined1 local_f0 [8];
  Handle proc;
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string mapsPath;
  DIR *dir;
  dirent *dire;
  Handle *out_local;
  string *name_local;
  
  if ((out == (Handle *)0x0) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
    name_local._7_1_ = 0;
  }
  else {
    __dirp = opendir("/proc/");
    if (__dirp == (DIR *)0x0) {
LAB_00109229:
      name_local._7_1_ = 0;
    }
    else {
      do {
        do {
          pdVar4 = readdir(__dirp);
          if (pdVar4 == (dirent *)0x0) {
            closedir(__dirp);
            goto LAB_00109229;
          }
        } while (pdVar4->d_type != '\x04');
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,pdVar4->d_name,&local_91);
        std::operator+((char *)local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/proc/"
                      );
        std::operator+(local_50,(char *)local_70);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        __name = (char *)std::__cxx11::string::c_str();
        iVar2 = access(__name,0);
        if (iVar2 == -1) {
          proc.regions.
          super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_110,pdVar4->d_name,&local_111);
          Handle::Handle((Handle *)local_f0,(string *)local_110);
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
          bVar1 = Handle::IsValid((Handle *)local_f0);
          if ((bVar1) && (bVar1 = Handle::IsRunning((Handle *)local_f0), bVar1)) {
            Handle::GetPath_abi_cxx11_((Handle *)&namePos);
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              lVar5 = std::__cxx11::string::find_last_of((char)&namePos,0x2f);
              if (lVar5 == -1) {
                proc.regions.
                super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
              }
              else {
                std::__cxx11::string::substr((ulong)local_160,(ulong)&namePos);
                iVar2 = std::__cxx11::string::compare(local_160);
                if (iVar2 == 0) {
                  Handle::operator=(out,(Handle *)local_f0);
                  name_local._7_1_ = 1;
                }
                proc.regions.
                super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
                proc.regions.
                super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = iVar2 == 0;
                std::__cxx11::string::~string(local_160);
              }
            }
            else {
              proc.regions.
              super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
            }
            std::__cxx11::string::~string((string *)&namePos);
          }
          else {
            proc.regions.
            super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
          }
          Handle::~Handle((Handle *)local_f0);
        }
        std::__cxx11::string::~string((string *)local_50);
      } while (((uint)proc.regions.
                      super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) ||
              ((uint)proc.regions.
                     super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage != 1));
    }
  }
  return (bool)(name_local._7_1_ & 1);
}

Assistant:

bool remote::FindProcessByName(std::string name, remote::Handle* out) {
    if(out == NULL || name.empty())
        return false;

    struct dirent *dire;

    DIR *dir = opendir("/proc/");

    if (dir) {
        while ((dire = readdir(dir)) != NULL) {
            if (dire->d_type != DT_DIR)
                continue;

            std::string mapsPath = ("/proc/" + std::string(dire->d_name) + "/maps");

            if (access(mapsPath.c_str(), F_OK) == -1)
                continue;

            remote::Handle proc(dire->d_name);

            if (!proc.IsValid() || !proc.IsRunning())
                continue;

            std::string procPath = proc.GetPath();

            if(procPath.empty())
                continue;

            size_t namePos = procPath.find_last_of('/');

            if(namePos == -1)
                continue; // what?

            std::string exeName = procPath.substr(namePos + 1);

            if(exeName.compare(name) == 0) {
                *out = proc;

                return true;
            }
        }

        closedir(dir);
    }

    return false;
}